

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QList<QSize> * __thiscall
QIconLoaderEngine::availableSizes
          (QList<QSize> *__return_storage_ptr__,QIconLoaderEngine *this,Mode mode,State state)

{
  pointer puVar1;
  QIconLoaderEngineEntry *pQVar2;
  QSize *pQVar3;
  int *piVar4;
  QSize *pQVar5;
  long lVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  QIcon local_50;
  QSize local_48;
  QSize *local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSize *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QSize>::reserve(__return_storage_ptr__,(long)puVar7 - (long)puVar1 >> 3);
  puVar7 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      pQVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
               .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
      if ((pQVar2->dir).type == Fallback) {
        QIcon::QIcon(&local_50,&pQVar2->filename);
        QIcon::availableSizes((QList<QSize> *)&local_48,&local_50,Normal,Off);
        if (local_38 != 0) {
          if (((int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i) == (int *)0x0) ||
             (1 < *(int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i))) {
            QtPrivate::QCommonArrayOps<QSize>::growAppend
                      ((QCommonArrayOps<QSize> *)__return_storage_ptr__,local_40,local_40 + local_38
                      );
          }
          else {
            QArrayDataPointer<QSize>::detachAndGrow
                      (&__return_storage_ptr__->d,GrowsAtEnd,local_38,(QSize **)0x0,
                       (QArrayDataPointer<QSize> *)0x0);
            if ((local_38 != 0) && (0 < local_38)) {
              pQVar3 = (__return_storage_ptr__->d).ptr;
              lVar6 = (__return_storage_ptr__->d).size;
              pQVar5 = local_40;
              do {
                pQVar3[lVar6] = *pQVar5;
                pQVar5 = pQVar5 + 1;
                lVar6 = (__return_storage_ptr__->d).size + 1;
                (__return_storage_ptr__->d).size = lVar6;
              } while (pQVar5 < local_40 + local_38);
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i),8,0x10);
          }
        }
        QIcon::~QIcon(&local_50);
      }
      else {
        local_48.wd.m_i = (int)(pQVar2->dir).size;
        local_48.ht.m_i = local_48.wd.m_i;
        QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
                  ((QMovableArrayOps<QSize> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_48);
        QList<QSize>::end(__return_storage_ptr__);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QSize> QIconLoaderEngine::availableSizes(QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    const qsizetype N = qsizetype(m_info.entries.size());
    QList<QSize> sizes;
    sizes.reserve(N);

    // Gets all sizes from the DirectoryInfo entries
    for (const auto &entry : m_info.entries) {
        if (entry->dir.type == QIconDirInfo::Fallback) {
            sizes.append(QIcon(entry->filename).availableSizes());
        } else {
            int size = entry->dir.size;
            sizes.append(QSize(size, size));
        }
    }
    return sizes;
}